

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::async_function_call_arglist_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_function *tfunc,
          bool use_base_method,bool include_types)

{
  t_struct *ptVar1;
  members_type *this_00;
  size_type sVar2;
  t_type *ttype;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_24;
  undefined1 local_23;
  byte local_22;
  undefined1 local_21;
  bool include_types_local;
  t_function *ptStack_20;
  bool use_base_method_local;
  t_function *tfunc_local;
  t_java_generator *this_local;
  string *arglist;
  
  local_23 = 0;
  local_22 = include_types;
  local_21 = use_base_method;
  ptStack_20 = tfunc;
  tfunc_local = (t_function *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  ptVar1 = t_function::get_arglist(ptStack_20);
  this_00 = t_struct::get_members(ptVar1);
  sVar2 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar2 != 0) {
    ptVar1 = t_function::get_arglist(ptStack_20);
    argument_list_abi_cxx11_(&local_78,this,ptVar1,(bool)(local_22 & 1));
    std::operator+(&local_58,&local_78,", ");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_22 & 1) != 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"org.apache.thrift.async.AsyncMethodCallback<");
    ttype = t_function::get_returntype(ptStack_20);
    type_name_abi_cxx11_(&local_b8,this,ttype,true,false,false,false);
    std::operator+(&local_98,&local_b8,"> ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"resultHandler");
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::async_function_call_arglist(t_function* tfunc,
                                                     bool use_base_method,
                                                     bool include_types) {
  (void)use_base_method;
  std::string arglist = "";
  if (tfunc->get_arglist()->get_members().size() > 0) {
    arglist = argument_list(tfunc->get_arglist(), include_types) + ", ";
  }

  if (include_types) {
    arglist += "org.apache.thrift.async.AsyncMethodCallback<";
    arglist += type_name(tfunc->get_returntype(), true) + "> ";
  }
  arglist += "resultHandler";

  return arglist;
}